

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerTriangles.cpp
# Opt level: O1

RGB __thiscall
RayTracerTriangles::processPixel(RayTracerTriangles *this,Segment *ray,int recursionLevel)

{
  RGB RVar1;
  Triangle local_c8;
  FindResult local_88;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_88.exists = false;
  local_88.triangle.normal.x = 0.0;
  local_88.triangle.normal.y = 0.0;
  local_88.triangle.normal.z = 0.0;
  local_88.triangle.reflectionCoefficient = 0.1;
  local_88.triangle.colorX.r = '\0';
  local_88.triangle.colorX.g = '\0';
  local_88.triangle.colorX.b = '\0';
  local_88.triangle.colorY.r = '\0';
  local_88.triangle.colorY.g = '\0';
  local_88.triangle.colorY.b = '\0';
  local_88.triangle.colorZ.r = '\0';
  local_88.triangle.colorZ.g = '\0';
  local_88.triangle.colorZ.b = '\0';
  if (this->kdTree != (KdNode *)0x0) {
    local_28._0_4_ = (ray->b).y;
    local_28._4_4_ = (ray->b).z;
    local_38._0_4_ = (ray->a).x;
    local_38._4_4_ = (ray->a).y;
    uStack_30 = *(undefined8 *)&(ray->a).z;
    local_c8.normal.x = 0.0;
    local_c8.normal.y = 0.0;
    local_c8.normal.z = 0.0;
    local_c8.reflectionCoefficient = 0.1;
    local_c8.x.x = 0.0;
    local_c8.x.y = 0.0;
    local_c8.x.z = 0.0;
    local_c8.y.x = 0.0;
    local_c8.y.y = 0.0;
    local_c8.y.z = 0.0;
    local_c8.z._0_5_ = 0;
    local_c8.z.y._1_3_ = 0;
    local_c8.z.z = 0.0;
    local_c8.colorX.r = '\0';
    local_c8.colorX.g = '\0';
    local_c8.colorX.b = '\0';
    local_c8.colorY.r = '\0';
    local_c8.colorY.g = '\0';
    local_c8.colorY.b = '\0';
    local_c8.colorZ.r = '\0';
    local_c8.colorZ.g = '\0';
    local_c8.colorZ.b = '\0';
    KdNode::find(&local_88,this->kdTree,*ray,&local_c8,0,1.1754944e-38,3.4028235e+38);
  }
  if (local_88.exists == false) {
    RVar1 = (this->super_RayTracerBase).config.super_BaseConfig.background;
  }
  else {
    RVar1 = processPixelOnTriangle(this,&ray->a,&local_88.point,&local_88.triangle,recursionLevel);
  }
  return RVar1;
}

Assistant:

RGB RayTracerTriangles::processPixel(Segment const& ray, int recursionLevel)
{
  FindResult triangleIntersec;
  if (kdTree != nullptr)
    triangleIntersec = kdTree->find(ray, Triangle{{0, 0, 0}, {0, 0, 0}, {0, 0, 0}}, 0, std::numeric_limits<float>::min(), std::numeric_limits<float>::max());
  if (triangleIntersec.exists == false)
    return processPixelOnBackground();

  return processPixelOnTriangle(ray.a, triangleIntersec.point, triangleIntersec.triangle,
                                recursionLevel);
}